

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1913a4::ReverbState::MixOutAmbiUp
          (ReverbState *this,span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut,
          size_t counter,size_t offset,size_t todo)

{
  anon_union_4096_2_95c9c352_for_ReverbState_18 *paVar1;
  array<float,_4UL> *paVar2;
  pointer pfVar3;
  BandSplitterR<float> *pBVar4;
  array<float,_4UL> *paVar5;
  long lVar6;
  float (*pafVar7) [16];
  span<float,_18446744073709551615UL> samples;
  span<float,_18446744073709551615UL> samples_00;
  span<float,_18446744073709551615UL> OutBuffer;
  span<const_float,_18446744073709551615UL> sVar8;
  span<float,_18446744073709551615UL> OutBuffer_00;
  span<const_float,_18446744073709551615UL> sVar9;
  span<const_float,_18446744073709551615UL> Gains;
  span<const_float,_18446744073709551615UL> Gains_00;
  
  paVar1 = &this->field_15;
  pfVar3 = (pointer)((long)this->mMaxUpdate + todo * 4 + 0x20);
  pafVar7 = (this->mEarly).PanGain;
  lVar6 = 0;
  paVar2 = (array<float,_4UL> *)((this->mOrderScales)._M_elems + 1);
  do {
    Gains.mDataEnd = (pointer)((anonymous_namespace)::A2B + lVar6 + 0x10);
    OutBuffer.mDataEnd = pfVar3;
    OutBuffer.mData = (pointer)paVar1;
    Gains.mData = (pointer)((anonymous_namespace)::A2B + lVar6);
    DoMixRow(OutBuffer,Gains,(float *)&this->mEarlySamples,0x100);
    paVar5 = paVar2;
    pBVar4 = (BandSplitterR<float> *)
             ((long)&(this->mAmbiSplitter)._M_elems[0]._M_elems[0].mCoeff + lVar6);
    if (lVar6 == 0) {
      paVar5 = &this->mOrderScales;
      pBVar4 = (BandSplitterR<float> *)&this->mAmbiSplitter;
    }
    samples.mDataEnd = pfVar3;
    samples.mData = (pointer)paVar1;
    BandSplitterR<float>::processHfScale(pBVar4,samples,paVar5->_M_elems[0]);
    sVar8.mDataEnd = pfVar3;
    sVar8.mData = (pointer)paVar1;
    (*MixSamples)(sVar8,samplesOut,pafVar7[-4],*pafVar7,counter,offset);
    lVar6 = lVar6 + 0x10;
    pafVar7 = pafVar7 + 1;
  } while (lVar6 != 0x40);
  pafVar7 = (this->mLate).PanGain;
  lVar6 = 0;
  do {
    Gains_00.mDataEnd = (pointer)((anonymous_namespace)::A2B + lVar6 + 0x10);
    OutBuffer_00.mDataEnd = pfVar3;
    OutBuffer_00.mData = (pointer)paVar1;
    Gains_00.mData = (pointer)((anonymous_namespace)::A2B + lVar6);
    DoMixRow(OutBuffer_00,Gains_00,(float *)&this->mLateSamples,0x100);
    paVar5 = paVar2;
    pBVar4 = (BandSplitterR<float> *)
             ((long)&(this->mAmbiSplitter)._M_elems[1]._M_elems[0].mCoeff + lVar6);
    if (lVar6 == 0) {
      paVar5 = &this->mOrderScales;
      pBVar4 = (this->mAmbiSplitter)._M_elems[1]._M_elems;
    }
    samples_00.mDataEnd = pfVar3;
    samples_00.mData = (pointer)paVar1;
    BandSplitterR<float>::processHfScale(pBVar4,samples_00,paVar5->_M_elems[0]);
    sVar9.mDataEnd = pfVar3;
    sVar9.mData = (pointer)paVar1;
    (*MixSamples)(sVar9,samplesOut,pafVar7[-4],*pafVar7,counter,offset);
    lVar6 = lVar6 + 0x10;
    pafVar7 = pafVar7 + 1;
  } while (lVar6 != 0x40);
  return;
}

Assistant:

void MixOutAmbiUp(const al::span<FloatBufferLine> samplesOut, const size_t counter,
        const size_t offset, const size_t todo)
    {
        ASSUME(todo > 0);

        const al::span<float> tmpspan{al::assume_aligned<16>(mTempLine.data()), todo};
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mEarlySamples[0].data(), mEarlySamples[0].size());

            /* Apply scaling to the B-Format's HF response to "upsample" it to
             * higher-order output.
             */
            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[0][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mEarly.CurrentGain[c], mEarly.PanGain[c], counter,
                offset);
        }
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mLateSamples[0].data(), mLateSamples[0].size());

            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[1][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mLate.CurrentGain[c], mLate.PanGain[c], counter,
                offset);
        }
    }